

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O2

string * __thiscall
lumeview::LoadStringFromFile_abi_cxx11_
          (string *__return_storage_ptr__,lumeview *this,char *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  ostream *poVar3;
  LumeviewError *this_00;
  string local_3d0;
  string buffer;
  ifstream t;
  byte abStack_208 [488];
  
  std::ifstream::ifstream(&t,(char *)this,_S_in);
  if ((abStack_208[*(long *)(_t + -0x18)] & 5) == 0) {
    std::istream::seekg((long)&t,_S_beg);
    cVar2 = std::istream::tellg();
    paVar1 = &buffer.field_2;
    buffer._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&buffer,cVar2);
    std::istream::seekg(&t,0,0);
    std::istream::read((char *)&t,(long)buffer._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)buffer._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(buffer.field_2._M_allocated_capacity._1_7_,buffer.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = buffer.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = buffer._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(buffer.field_2._M_allocated_capacity._1_7_,buffer.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = buffer._M_string_length;
    buffer._M_string_length = 0;
    buffer.field_2._M_local_buf[0] = '\0';
    buffer._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::~string((string *)&buffer);
    std::ifstream::~ifstream(&t);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&buffer);
  poVar3 = std::operator<<((ostream *)buffer.field_2._M_local_buf,"FILE::LOAD_FROM_STRING");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar3,"Couldn\'t find file ");
  std::operator<<(poVar3,(char *)this);
  this_00 = (LumeviewError *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  LumeviewError::LumeviewError(this_00,&local_3d0);
  __cxa_throw(this_00,&LumeviewError::typeinfo,LumeviewError::~LumeviewError);
}

Assistant:

string LoadStringFromFile (const char* filename)
{
	ifstream t(filename);
	COND_THROW (!t, "FILE::LOAD_FROM_STRING" << endl <<
	            "Couldn't find file " << filename);
	t.seekg(0, ios::end);
	size_t size = t.tellg();
	string buffer(size, ' ');
	t.seekg(0);
	t.read(&buffer[0], size);
	return std::move(buffer);
}